

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_ConvertToRgb(ConvertToRgbForm2 ConvertToRgb)

{
  uint8_t value;
  bool bVar1;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  
  Unit_Test::intensityArray(&intensity,2);
  value = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,value,0,0,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&output,input._width,input._height,'\x03','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::fill
            (&output,intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[1]);
  (*ConvertToRgb)(&input,&output);
  bVar1 = Unit_Test::verifyImage
                    (&output,*intensity.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool form2_ConvertToRgb(ConvertToRgbForm2 ConvertToRgb)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input = uniformImage( intensity[0] );
        PenguinV_Image::Image output( input.width(), input.height(), PenguinV_Image::RGB );

        output.fill( intensity[1] );

        ConvertToRgb( input, output );

        return verifyImage( output, intensity[0] );
    }